

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

int Cut_CutCheckDominance(Cut_Cut_t *pDom,Cut_Cut_t *pCut)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    if (uVar1 == *(uint *)pDom >> 0x1c) {
      return 1;
    }
    uVar2 = 0;
    while( true ) {
      if (*(uint *)pCut >> 0x1c == uVar2) {
        return 0;
      }
      if (*(int *)(&pDom[1].field_0x0 + uVar1 * 4) == *(int *)(&pCut[1].field_0x0 + uVar2 * 4))
      break;
      uVar2 = uVar2 + 1;
    }
    uVar1 = uVar1 + 1;
  } while (*(uint *)pCut >> 0x1c != (uint)uVar2);
  return 0;
}

Assistant:

static inline int Cut_CutCheckDominance( Cut_Cut_t * pDom, Cut_Cut_t * pCut )
{
    int i, k;
    for ( i = 0; i < (int)pDom->nLeaves; i++ )
    {
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            if ( pDom->pLeaves[i] == pCut->pLeaves[k] )
                break;
        if ( k == (int)pCut->nLeaves ) // node i in pDom is not contained in pCut
            return 0;
    }
    // every node in pDom is contained in pCut
    return 1;
}